

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

TPZVec<TPZGeoElSide> * __thiscall
TPZVec<TPZGeoElSide>::operator=(TPZVec<TPZGeoElSide> *this,TPZVec<TPZGeoElSide> *rval)

{
  TPZGeoElSide *pTVar1;
  TPZGeoElSide *pTVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  if (this != rval) {
    this->fNElements = rval->fNElements;
    pTVar1 = this->fStore;
    if (pTVar1 != (TPZGeoElSide *)0x0) {
      operator_delete__(&pTVar1[-1].fSide,*(long *)&pTVar1[-1].fSide * 0x18 + 8);
    }
    if (rval->fNAlloc == 0) {
      uVar9 = this->fNElements;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar9;
      uVar4 = SUB168(auVar3 * ZEXT816(0x18),0);
      uVar5 = uVar4 + 8;
      if (0xfffffffffffffff7 < uVar4) {
        uVar5 = 0xffffffffffffffff;
      }
      uVar4 = 0xffffffffffffffff;
      if (SUB168(auVar3 * ZEXT816(0x18),8) == 0) {
        uVar4 = uVar5;
      }
      puVar6 = (ulong *)operator_new__(uVar4);
      *puVar6 = uVar9;
      if (uVar9 == 0) {
        this->fStore = (TPZGeoElSide *)(puVar6 + 1);
        uVar9 = 0;
      }
      else {
        lVar8 = 0;
        do {
          *(undefined ***)((long)puVar6 + lVar8 + 8) = &PTR__TPZGeoElSide_018f8760;
          *(undefined8 *)((long)puVar6 + lVar8 + 0x10) = 0;
          *(undefined4 *)((long)puVar6 + lVar8 + 0x18) = 0xffffffff;
          lVar8 = lVar8 + 0x18;
        } while (uVar9 * 0x18 != lVar8);
        this->fStore = (TPZGeoElSide *)(puVar6 + 1);
        if (0 < (long)uVar9) {
          lVar8 = 8;
          lVar7 = 0;
          do {
            pTVar1 = rval->fStore;
            pTVar2 = this->fStore;
            *(undefined4 *)((long)&pTVar2->fGeoEl + lVar8) =
                 *(undefined4 *)((long)&pTVar1->fGeoEl + lVar8);
            *(undefined8 *)((long)&(pTVar2->super_TPZSavable)._vptr_TPZSavable + lVar8) =
                 *(undefined8 *)((long)&(pTVar1->super_TPZSavable)._vptr_TPZSavable + lVar8);
            lVar7 = lVar7 + 1;
            uVar9 = this->fNElements;
            lVar8 = lVar8 + 0x18;
          } while (lVar7 < (long)uVar9);
        }
      }
    }
    else {
      this->fStore = rval->fStore;
      uVar9 = this->fNElements;
    }
    this->fNAlloc = uVar9;
    rval->fStore = (TPZGeoElSide *)0x0;
    rval->fNElements = 0;
    rval->fNAlloc = 0;
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(TPZVec<T> &&rval){
	if(this != &rval){
        fNElements = rval.fNElements;
        if(fStore) delete [] fStore;
        if(rval.fNAlloc){
            fStore = rval.fStore;
        }else{
            fStore = new T[fNElements];
            for (int64_t i = 0; i < fNElements; i++)
                fStore[i] = rval.fStore[i];
        }
        fNAlloc = fNElements;//perhaps rval.fNalloc was 0
        rval.fStore = nullptr;
        rval.fNElements = 0;
        rval.fNAlloc = 0;
	}
	return *this;
}